

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O0

void Qentem::Test::TestIfUTag2(QTest *test)

{
  Value<char16_t> *this;
  StringStream<char16_t> *pSVar1;
  char16_t *content;
  Value<char16_t> value;
  StringStream<char16_t> ss;
  QTest *test_local;
  
  StringStream<char16_t>::StringStream((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::Value((Value<char16_t> *)&content);
  this = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"name");
  Value<char16_t>::operator=(this,L"Qentem");
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\">{var:name}",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[24]>
            (test,pSVar1,(char16_t (*) [24])L"<if case=\"1\">{var:name}",0xdb6);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if<if case=\"1\">{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[32]>
            (test,pSVar1,(char16_t (*) [32])L"<if<if case=\"1\">{var:name}</if>",0xdba);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\"><if case=\"1\">{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[42]>
            (test,pSVar1,(char16_t (*) [42])L"<if case=\"1\"><if case=\"1\">{var:name}</if>",0xdbe);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[60]>
            (test,pSVar1,
             (char16_t (*) [60])L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>"
             ,0xdc3);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"ABC\">{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,pSVar1,(char16_t (*) [1])0x138e0e,0xdc7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if>{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,pSVar1,(char16_t (*) [1])0x138e0e,0xdcb);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"><elseif />{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[39]>
            (test,pSVar1,(char16_t (*) [39])L"<if case=\"0\"><elseif />{var:name}</if>",0xdcf);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<iw case=\"0\">{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[25]>
            (test,pSVar1,(char16_t (*) [25])L"<iw case=\"0\">Qentem</if>",0xdd3);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"{var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[28]>
            (test,pSVar1,(char16_t (*) [28])L"<if case=\"0\"{var:name}</if>",0xdd7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"><else {var:name}</if>",(Value<char16_t> *)&content,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[35]>
            (test,pSVar1,(char16_t (*) [35])L"<if case=\"0\"><else {var:name}</if>",0xddb);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::~Value((Value<char16_t> *)&content);
  StringStream<char16_t>::~StringStream((StringStream<char16_t> *)&value.type_);
  return;
}

Assistant:

static void TestIfUTag2(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    value[uR"(name)"] = uR"(Qentem)";

    content = uR"(<if case="1">{var:name})";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1">{var:name})", __LINE__);
    ss.Clear();

    content = uR"(<if<if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if<if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1"><if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)";
    test.IsEqual(Template::Render(content, value, ss),
                 uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="ABC">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if>{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><elseif />{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><elseif />{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<iw case="0">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<iw case="0">Qentem</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><else {var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><else {var:name}</if>)", __LINE__);
    ss.Clear();
}